

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nested_cylinders.cc
# Opt level: O3

string * concat<char_const(&)[16],unsigned_int,char_const(&)[5]>
                   (string *__return_storage_ptr__,char (*args) [16],uint *args_1,char (*args_2) [5]
                   )

{
  size_t sVar1;
  ostream *poVar2;
  ostringstream ss;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  sVar1 = strlen(*args);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,*args,sVar1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  sVar1 = strlen(*args_2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,*args_2,sVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string concat(Args &&...args) {
  std::ostringstream ss;  // NOLINT(misc-const-correctness)
  (ss << ... << args);
  return ss.str();
}